

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O1

void __thiscall
llvm::DWARFUnitVector::addUnitsForSection
          (DWARFUnitVector *this,DWARFContext *C,DWARFSection *Section,DWARFSectionKind SectionKind)

{
  DWARFObject *Obj;
  StringRef SS;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  DWARFDebugAbbrev *DA;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t extraout_RDX;
  
  Obj = (C->DObj)._M_t.
        super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
        .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  DA = DWARFContext::getDebugAbbrev(C);
  iVar1 = (*Obj->_vptr_DWARFObject[0x12])(Obj);
  iVar2 = (*Obj->_vptr_DWARFObject[10])(Obj);
  iVar3 = (*Obj->_vptr_DWARFObject[0x11])(Obj);
  SS.Data._4_4_ = extraout_var_01;
  SS.Data._0_4_ = iVar3;
  iVar3 = (*Obj->_vptr_DWARFObject[0x19])(Obj);
  iVar4 = (*Obj->_vptr_DWARFObject[0x23])(Obj);
  iVar5 = (*Obj->_vptr_DWARFObject[0xf])(Obj);
  iVar6 = (*Obj->_vptr_DWARFObject[5])(Obj);
  SS.Length = extraout_RDX;
  addUnitsImpl(this,C,Obj,Section,DA,(DWARFSection *)CONCAT44(extraout_var,iVar1),
               (DWARFSection *)CONCAT44(extraout_var_00,iVar2),SS,
               (DWARFSection *)CONCAT44(extraout_var_02,iVar3),
               (DWARFSection *)CONCAT44(extraout_var_03,iVar4),
               (DWARFSection *)CONCAT44(extraout_var_04,iVar5),SUB41(iVar6,0),false,false,
               SectionKind);
  return;
}

Assistant:

void DWARFUnitVector::addUnitsForSection(DWARFContext &C,
                                         const DWARFSection &Section,
                                         DWARFSectionKind SectionKind) {
  const DWARFObject &D = C.getDWARFObj();
  addUnitsImpl(C, D, Section, C.getDebugAbbrev(), &D.getRangesSection(),
               &D.getLocSection(), D.getStrSection(),
               D.getStrOffsetsSection(), &D.getAddrSection(),
               D.getLineSection(), D.isLittleEndian(), false, false,
               SectionKind);
}